

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O1

void __thiscall Mems::give_every_mirror_a_sample_slow(Mems *this)

{
  Point_d *pPVar1;
  void *__src;
  Point_d *pPVar2;
  long *plVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> __first;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> __last;
  double *pdVar7;
  pointer pPVar8;
  void *__dest;
  void *pvVar9;
  double dVar10;
  double dVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  Point_d *pPVar14;
  ulong uVar15;
  ostream *poVar16;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> _Var17;
  long lVar18;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> _Var19;
  size_t __n;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> __i;
  pointer pMVar20;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> _Var21;
  Point_d *pPVar22;
  long lVar23;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"give every mirror a sample",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  _Var19._M_current =
       (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var21._M_current =
       (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var19._M_current != _Var21._M_current) {
    uVar15 = ((long)_Var21._M_current - (long)_Var19._M_current >> 3) * -0xf0f0f0f0f0f0f0f;
    lVar18 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
              (_Var19,_Var21,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b31e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
              (_Var19,_Var21,(_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b31e);
  }
  _Var19._M_current =
       (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var21._M_current =
       (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar15 = ((long)_Var21._M_current - (long)_Var19._M_current >> 3) * -0xf0f0f0f0f0f0f0f;
  if ((ulong)((long)(this->_mems_mirrors_randomrasterized).
                    super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->_mems_mirrors_randomrasterized).
                   super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                   super__Vector_impl_data._M_start) <
      (ulong)((long)_Var21._M_current - (long)_Var19._M_current)) {
    do {
      if (_Var19._M_current != _Var21._M_current) {
        lVar18 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar18 == 0; lVar18 = lVar18 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
                  (_Var19,_Var21,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b35a);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
                  (_Var19,_Var21,(_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b35a
                  );
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mirror with smallest ammount of samples has  ",0x2d);
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," samples. ",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      for (pMVar20 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pMVar20 !=
          (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
          super__Vector_impl_data._M_finish; pMVar20 = pMVar20 + 1) {
        __first._M_current =
             (pMVar20->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
             _M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (pMVar20->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__first._M_current != __last._M_current) {
          uVar15 = (long)__last._M_current - (long)__first._M_current >> 5;
          lVar18 = 0x3f;
          if (uVar15 != 0) {
            for (; uVar15 >> lVar18 == 0; lVar18 = lVar18 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<Point_d*,std::vector<Point_d,std::allocator<Point_d>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Point_d_const&,Point_d_const&)>>
                    (__first,__last,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(const_Point_d_&,_const_Point_d_&)>)0x10b369);
          _Var17._M_current = __first._M_current;
          if ((long)__last._M_current - (long)__first._M_current < 0x201) {
            while (pPVar22 = _Var17._M_current + 1, pPVar22 != __last._M_current) {
              dVar4 = pPVar22->dis;
              if ((__first._M_current)->dis <= dVar4) {
                dVar10 = pPVar22->x;
                dVar11 = pPVar22->y;
                iVar6 = pPVar22->id;
                dVar5 = (_Var17._M_current)->dis;
                pPVar2 = pPVar22;
                while (dVar4 < dVar5) {
                  uVar12 = *(undefined8 *)((long)&pPVar2[-1].dis + 4);
                  *(undefined8 *)((long)&pPVar2->y + 4) = *(undefined8 *)((long)&pPVar2[-1].y + 4);
                  *(undefined8 *)((long)&pPVar2->dis + 4) = uVar12;
                  dVar5 = pPVar2[-1].y;
                  pPVar2->x = pPVar2[-1].x;
                  pPVar2->y = dVar5;
                  dVar5 = pPVar2[-2].dis;
                  pPVar2 = pPVar2 + -1;
                }
                pPVar2->x = dVar10;
                pPVar2->y = dVar11;
                pPVar2->dis = dVar4;
                pPVar2->id = iVar6;
                _Var17._M_current = pPVar22;
              }
              else {
                dVar4 = pPVar22->x;
                dVar5 = pPVar22->y;
                local_48 = SUB84(pPVar22->dis,0);
                uStack_44 = (undefined4)((ulong)pPVar22->dis >> 0x20);
                uStack_40 = (undefined4)*(undefined8 *)&pPVar22->id;
                uStack_4c = (undefined4)((ulong)dVar5 >> 0x20);
                memmove((void *)((long)_Var17._M_current +
                                (0x40 - ((long)pPVar22 - (long)__first._M_current))),
                        __first._M_current,(long)pPVar22 - (long)__first._M_current);
                (__first._M_current)->x = dVar4;
                (__first._M_current)->y = dVar5;
                *(ulong *)((long)&(__first._M_current)->y + 4) = CONCAT44(local_48,uStack_4c);
                *(ulong *)((long)&(__first._M_current)->dis + 4) = CONCAT44(uStack_40,uStack_44);
                _Var17._M_current = pPVar22;
              }
            }
          }
          else {
            __n = 0x20;
            pPVar22 = __first._M_current + 1;
            do {
              pPVar2 = (Point_d *)((long)&(__first._M_current)->x + __n);
              dVar4 = *(double *)((long)&(__first._M_current)->dis + __n);
              if ((__first._M_current)->dis <= dVar4) {
                dVar10 = pPVar2->x;
                dVar11 = pPVar2->y;
                iVar6 = pPVar2->id;
                dVar5 = (_Var17._M_current)->dis;
                pPVar1 = pPVar2;
                pPVar14 = pPVar22;
                while (dVar4 < dVar5) {
                  pPVar1 = pPVar14 + -1;
                  uVar12 = *(undefined8 *)((long)&pPVar14[-1].dis + 4);
                  *(undefined8 *)((long)&pPVar14->y + 4) = *(undefined8 *)((long)&pPVar14[-1].y + 4)
                  ;
                  *(undefined8 *)((long)&pPVar14->dis + 4) = uVar12;
                  dVar5 = pPVar14[-1].y;
                  pPVar14->x = pPVar14[-1].x;
                  pPVar14->y = dVar5;
                  dVar5 = pPVar14[-2].dis;
                  pPVar14 = pPVar1;
                }
                pPVar1->x = dVar10;
                pPVar1->y = dVar11;
                pPVar1->dis = dVar4;
                pPVar1->id = iVar6;
              }
              else {
                dVar4 = pPVar2->x;
                dVar5 = pPVar2->y;
                local_48 = SUB84(pPVar2->dis,0);
                uStack_44 = (undefined4)((ulong)pPVar2->dis >> 0x20);
                uStack_40 = (undefined4)*(undefined8 *)&pPVar2->id;
                uStack_4c = (undefined4)((ulong)dVar5 >> 0x20);
                memmove(__first._M_current + 1,__first._M_current,__n);
                (__first._M_current)->x = dVar4;
                (__first._M_current)->y = dVar5;
                *(ulong *)((long)&(__first._M_current)->y + 4) = CONCAT44(local_48,uStack_4c);
                *(ulong *)((long)&(__first._M_current)->dis + 4) = CONCAT44(uStack_40,uStack_44);
              }
              __n = __n + 0x20;
              pPVar22 = pPVar22 + 1;
              _Var17._M_current = pPVar2;
            } while (__n != 0x200);
            for (pPVar22 = __first._M_current + 0x10; pPVar22 != __last._M_current;
                pPVar22 = pPVar22 + 1) {
              dVar10 = pPVar22->x;
              dVar11 = pPVar22->y;
              dVar4 = pPVar22->dis;
              iVar6 = pPVar22->id;
              dVar5 = pPVar22[-1].dis;
              pPVar2 = pPVar22;
              while (dVar4 < dVar5) {
                uVar12 = *(undefined8 *)((long)&pPVar2[-1].dis + 4);
                *(undefined8 *)((long)&pPVar2->y + 4) = *(undefined8 *)((long)&pPVar2[-1].y + 4);
                *(undefined8 *)((long)&pPVar2->dis + 4) = uVar12;
                dVar5 = pPVar2[-1].y;
                pPVar2->x = pPVar2[-1].x;
                pPVar2->y = dVar5;
                dVar5 = pPVar2[-2].dis;
                pPVar2 = pPVar2 + -1;
              }
              pPVar2->x = dVar10;
              pPVar2->y = dVar11;
              pPVar2->dis = dVar4;
              pPVar2->id = iVar6;
            }
          }
        }
      }
      pMVar20 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar7 = *(double **)
                &(pMVar20->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                 _M_impl;
      dVar4 = pdVar7[1];
      uVar12 = *(undefined8 *)((long)pdVar7 + 0xc);
      uVar13 = *(undefined8 *)((long)pdVar7 + 0x14);
      (pMVar20->_displayed_sample).x = *pdVar7;
      (pMVar20->_displayed_sample).y = dVar4;
      *(undefined8 *)((long)&(pMVar20->_displayed_sample).y + 4) = uVar12;
      *(undefined8 *)((long)&(pMVar20->_displayed_sample).dis + 4) = uVar13;
      pMVar20 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar20->has_sample = true;
      pPVar8 = *(pointer *)
                &(pMVar20->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                 _M_impl;
      if (*(pointer *)
           ((long)&(pMVar20->_matching_samples).
                   super__Vector_base<Point_d,_std::allocator<Point_d>_> + 8) != pPVar8) {
        *(pointer *)
         ((long)&(pMVar20->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>
         + 8) = pPVar8;
      }
      ((this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
       super__Vector_impl_data._M_start)->_ammount_of_matching_samples = 0xd9038;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"_mems_mirror.begin() on pos: x: ",0x20);
      poVar16 = std::ostream::_M_insert<double>
                          ((((this->_mems_mirrors).
                             super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                             super__Vector_impl_data._M_start)->_position).x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," y: ",4);
      poVar16 = std::ostream::_M_insert<double>
                          ((((this->_mems_mirrors).
                             super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                             super__Vector_impl_data._M_start)->_position).y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"_mems_mirror.begin() shows now: x: ",0x23);
      poVar16 = std::ostream::_M_insert<double>
                          ((((this->_mems_mirrors).
                             super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                             super__Vector_impl_data._M_start)->_displayed_sample).x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," y: ",4);
      poVar16 = std::ostream::_M_insert<double>
                          ((((this->_mems_mirrors).
                             super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                             super__Vector_impl_data._M_start)->_displayed_sample).y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      pMVar20 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
          super__Vector_impl_data._M_finish != pMVar20) {
        lVar18 = 0x28;
        lVar23 = 0;
        do {
          if (*(char *)((long)&pMVar20->_ammount_of_matching_samples + lVar18) == '\0') {
            __dest = *(void **)((long)&pMVar20->id + lVar18);
            pvVar9 = *(void **)((long)&(pMVar20->_position).x + lVar18);
            if ((pvVar9 != __dest) &&
               ((pMVar20->_displayed_sample).id == *(int *)((long)__dest + 0x18))) {
              __src = (void *)((long)__dest + 0x20);
              if (__src != pvVar9) {
                memmove(__dest,__src,(long)pvVar9 - (long)__src);
              }
              plVar3 = (long *)((long)&(pMVar20->_position).x + lVar18);
              *plVar3 = *plVar3 + -0x20;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"sample erased  ",0xf);
            }
          }
          lVar23 = lVar23 + 1;
          pMVar20 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar18 = lVar18 + 0x88;
        } while (lVar23 != ((long)(this->_mems_mirrors).
                                  super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pMVar20 >> 3) *
                           -0xf0f0f0f0f0f0f0f);
      }
      std::vector<Mirror,_std::allocator<Mirror>_>::push_back
                (&this->_mems_mirrors_randomrasterized,pMVar20);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"new mirrorvector has size: ",0x1b);
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      _Var19._M_current =
           (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
           super__Vector_impl_data._M_start;
      _Var21._M_current =
           (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar15 = ((long)_Var21._M_current - (long)_Var19._M_current >> 3) * -0xf0f0f0f0f0f0f0f;
    } while ((ulong)((long)(this->_mems_mirrors_randomrasterized).
                           super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->_mems_mirrors_randomrasterized).
                          super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                          super__Vector_impl_data._M_start) <
             (ulong)((long)_Var21._M_current - (long)_Var19._M_current));
  }
  if (_Var19._M_current != _Var21._M_current) {
    lVar18 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
              (_Var19,_Var21,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b33a);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
              (_Var19,_Var21,(_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b33a);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"give every mirror a sample ends now. ",0x25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  return;
}

Assistant:

void Mems::give_every_mirror_a_sample_slow(){
      std::cout<<"\n";

      std::cout<<"give every mirror a sample"<< "\n"<< "\n";
      std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_ammount_of_matching_samples);

      while(_mems_mirrors_randomrasterized.size() < _mems_mirrors.size())
      {
  //      std::cout<<"Pixels left: "<<_mems_mirrors.size()<<"\n";
        //sorting mems for sample availability
        std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_ammount);

        std::cout << "Mirror with smallest ammount of samples has  " <<_mems_mirrors.begin()->_matching_samples.size()<<" samples. " <<"\n";
        //gehe durch alle spiegel und sortiere ihren sample vector der größe nach
        for(auto mirror = std::begin(_mems_mirrors); mirror != std::end(_mems_mirrors); ++mirror)
        {
          std::sort(mirror->_matching_samples.begin(), mirror->_matching_samples.end(), compare_by_distance);
        }

        // give first mirror(am wenigsten matches) sample_displayed which is at matching samples first position
        _mems_mirrors.begin()->_displayed_sample = _mems_mirrors.begin()->_matching_samples.front();
        _mems_mirrors.begin()->has_sample = true;
        _mems_mirrors.begin()->_matching_samples.clear();
        _mems_mirrors.begin()->_ammount_of_matching_samples = 888888;
        std::cout<<"_mems_mirror.begin() on pos: x: "<<_mems_mirrors.begin()->_position.x<<" y: "<<_mems_mirrors.begin()->_position.y<<"\n";
        std::cout<<"_mems_mirror.begin() shows now: x: "<<_mems_mirrors.begin()->_displayed_sample.x<<" y: "<<_mems_mirrors.begin()->_displayed_sample.y<<"\n";

        //point aus allen umliegenden mirrors als available point löschen

        for(int it = 0; it != _mems_mirrors.size(); ++it){
          //std::cout<<"mi erased0  ";
          if(_mems_mirrors[it].has_sample == false){

            for(int mi = 0; mi != _mems_mirrors[it]._matching_samples.size(); ++mi){

              if(_mems_mirrors.begin()->_displayed_sample.id == _mems_mirrors[it]._matching_samples[mi].id){
              /*  std::cout<< "matching samples size before erase: "<< _mems_mirrors[it]._matching_samples.size()<<"\n";
                for( auto debug = std::begin(_mems_mirrors[it]._matching_samples); debug != std::end(_mems_mirrors[it]._matching_samples); ++debug){
                  std::cout<<debug->id<<" is id of sample "<<"\n";
                }
                */
                _mems_mirrors[it]._matching_samples.erase(_mems_mirrors[it]._matching_samples.begin()+ mi);
              //  it->_ammount_of_matching_samples = it->_matching_samples.size();
                std::cout<<"sample erased  ";

              /*  std::cout<< "matching samples size after erase: "<< _mems_mirrors[it]._matching_samples.size()<<"\n";
                for( auto debug = std::begin(_mems_mirrors[it]._matching_samples); debug != std::end(_mems_mirrors[it]._matching_samples); ++debug){
                  std::cout<<debug->id<<" is id "<<"\n";
                }
                */
              }
              break;
            }
          }
        }
        _mems_mirrors_randomrasterized.push_back(*_mems_mirrors.begin());
        std::cout<<"new mirrorvector has size: "<<_mems_mirrors_randomrasterized.size()<<"\n"<<"\n"<<"\n"<<"\n";

        }
        std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_idi);
        std::cout<<"give every mirror a sample ends now. "<<"\n";


      }